

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadHandler.cxx
# Opt level: O0

void __thiscall cmCTestUploadHandler::cmCTestUploadHandler(cmCTestUploadHandler *this)

{
  cmCTestUploadHandler *this_local;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_00a85a48;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Files);
  (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])();
  return;
}

Assistant:

cmCTestUploadHandler::cmCTestUploadHandler()
{
  this->Initialize();
}